

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_vertical_8_dual_sse2
               (uint16_t *s,int p,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,uint8_t *blimit1
               ,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  uint16_t *puVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  uint16_t uVar49;
  uint16_t uVar50;
  uint16_t uVar51;
  uint16_t uVar52;
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  uint16_t uVar65;
  uint16_t uVar66;
  uint16_t uVar67;
  uint16_t uVar68;
  uint16_t uVar69;
  uint16_t uVar70;
  uint16_t uVar71;
  uint16_t uVar72;
  uint16_t uVar73;
  uint16_t uVar74;
  uint16_t uVar75;
  uint16_t uVar76;
  uint16_t uVar77;
  uint16_t uVar78;
  uint16_t uVar79;
  uint16_t uVar80;
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  unkbyte10 Var107;
  long lVar108;
  long lVar109;
  ushort uVar110;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar120;
  undefined1 auVar111 [12];
  short sVar123;
  short sVar125;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  ushort uVar122;
  ushort uVar124;
  ushort uVar126;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  short sVar129;
  short sVar130;
  undefined4 uVar131;
  short sVar136;
  short sVar138;
  short sVar140;
  short sVar142;
  short sVar143;
  short sVar144;
  undefined1 auVar134 [16];
  short sVar137;
  short sVar139;
  short sVar141;
  short sVar145;
  undefined1 auVar135 [16];
  undefined1 auVar146 [12];
  short sVar153;
  short sVar154;
  undefined1 auVar148 [16];
  ushort uVar155;
  ushort uVar166;
  ushort uVar167;
  ushort uVar168;
  ushort uVar169;
  ushort uVar170;
  ushort uVar171;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  ushort uVar172;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  short sVar178;
  short sVar190;
  short sVar191;
  short sVar192;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  short sVar193;
  short sVar194;
  short sVar195;
  short sVar196;
  short sVar197;
  short sVar203;
  short sVar204;
  short sVar205;
  short sVar206;
  short sVar207;
  short sVar208;
  short sVar209;
  short sVar210;
  short sVar211;
  short sVar212;
  short sVar213;
  short sVar214;
  short sVar215;
  short sVar216;
  short sVar217;
  short sVar218;
  short sVar219;
  short sVar220;
  short sVar221;
  short sVar222;
  short sVar223;
  short sVar224;
  short sVar225;
  short sVar226;
  short sVar227;
  short sVar228;
  short sVar229;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  short sVar230;
  short sVar231;
  short sVar232;
  short sVar233;
  undefined4 uVar234;
  undefined1 auVar235 [12];
  short sVar242;
  short sVar243;
  undefined1 auVar238 [16];
  undefined4 uVar244;
  undefined4 uVar247;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined4 uVar255;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  ushort uVar261;
  ushort uVar268;
  ushort uVar269;
  ushort uVar270;
  ushort uVar271;
  ushort uVar272;
  ushort uVar273;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  ushort uVar274;
  undefined1 auVar267 [16];
  undefined1 auVar275 [12];
  short sVar283;
  short sVar284;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  short sVar285;
  short sVar293;
  short sVar294;
  short sVar295;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  ushort uVar296;
  ushort uVar300;
  ushort uVar301;
  ushort uVar302;
  ushort uVar303;
  ushort uVar304;
  ushort uVar305;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  ushort uVar306;
  undefined1 auVar299 [16];
  short sVar119;
  short sVar121;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar149 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  short sVar151;
  short sVar152;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar236 [12];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  short sVar240;
  short sVar241;
  undefined1 auVar245 [12];
  undefined1 auVar246 [16];
  undefined1 auVar248 [12];
  undefined1 auVar254 [16];
  undefined1 auVar256 [12];
  undefined1 auVar260 [16];
  undefined1 auVar276 [16];
  short sVar281;
  short sVar282;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  
  auVar112 = *(undefined1 (*) [16])(s + -4);
  puVar1 = s + (long)p + -4;
  uVar49 = *puVar1;
  uVar50 = puVar1[1];
  uVar51 = puVar1[2];
  uVar52 = puVar1[3];
  uVar53 = puVar1[4];
  uVar54 = puVar1[5];
  uVar55 = puVar1[6];
  uVar56 = puVar1[7];
  auVar113 = *(undefined1 (*) [16])(s + (long)(p * 2) + -4);
  lVar109 = (long)(p * 3);
  puVar1 = s + lVar109 + -4;
  uVar57 = *puVar1;
  uVar58 = puVar1[1];
  uVar59 = puVar1[2];
  uVar60 = puVar1[3];
  uVar61 = puVar1[4];
  uVar62 = puVar1[5];
  uVar63 = puVar1[6];
  uVar64 = puVar1[7];
  auVar134 = *(undefined1 (*) [16])(s + (long)(p * 4) + -4);
  puVar1 = s + (long)(p * 5) + -4;
  uVar65 = *puVar1;
  uVar66 = puVar1[1];
  uVar67 = puVar1[2];
  uVar68 = puVar1[3];
  uVar69 = puVar1[4];
  uVar70 = puVar1[5];
  uVar71 = puVar1[6];
  uVar72 = puVar1[7];
  auVar157 = *(undefined1 (*) [16])(s + (long)(p * 6) + -4);
  auVar250 = *(undefined1 (*) [16])blimit0;
  lVar108 = (long)(p * 7);
  puVar1 = s + lVar108 + -4;
  uVar73 = *puVar1;
  uVar74 = puVar1[1];
  uVar75 = puVar1[2];
  uVar76 = puVar1[3];
  uVar77 = puVar1[4];
  uVar78 = puVar1[5];
  uVar79 = puVar1[6];
  uVar80 = puVar1[7];
  sVar295 = auVar112._6_2_;
  auVar289._0_12_ = auVar112._0_12_;
  auVar289._12_2_ = sVar295;
  auVar289._14_2_ = uVar52;
  auVar288._12_4_ = auVar289._12_4_;
  auVar288._0_10_ = auVar112._0_10_;
  auVar288._10_2_ = uVar51;
  sVar294 = auVar112._4_2_;
  auVar287._10_6_ = auVar288._10_6_;
  auVar287._0_8_ = auVar112._0_8_;
  auVar287._8_2_ = sVar294;
  auVar81._4_8_ = auVar287._8_8_;
  auVar81._2_2_ = uVar50;
  sVar293 = auVar112._2_2_;
  auVar81._0_2_ = sVar293;
  sVar285 = auVar112._0_2_;
  auVar286._0_4_ = CONCAT22(uVar49,sVar285);
  auVar286._4_12_ = auVar81;
  sVar140 = auVar113._6_2_;
  auVar133._0_12_ = auVar113._0_12_;
  auVar133._12_2_ = sVar140;
  auVar133._14_2_ = uVar60;
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._0_10_ = auVar113._0_10_;
  auVar132._10_2_ = uVar59;
  sVar138 = auVar113._4_2_;
  auVar266._10_6_ = auVar132._10_6_;
  auVar266._0_8_ = auVar113._0_8_;
  auVar266._8_2_ = sVar138;
  auVar82._4_8_ = auVar266._8_8_;
  auVar82._2_2_ = uVar58;
  sVar136 = auVar113._2_2_;
  auVar82._0_2_ = sVar136;
  sVar129 = auVar113._0_2_;
  sVar192 = auVar134._6_2_;
  auVar181._0_12_ = auVar134._0_12_;
  auVar181._12_2_ = sVar192;
  auVar181._14_2_ = uVar68;
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._0_10_ = auVar134._0_10_;
  auVar180._10_2_ = uVar67;
  sVar191 = auVar134._4_2_;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._0_8_ = auVar134._0_8_;
  auVar179._8_2_ = sVar191;
  auVar83._4_8_ = auVar179._8_8_;
  auVar83._2_2_ = uVar66;
  sVar190 = auVar134._2_2_;
  auVar83._0_2_ = sVar190;
  sVar178 = auVar134._0_2_;
  auVar262._0_8_ = auVar83._0_8_ << 0x20;
  sVar213 = auVar157._6_2_;
  auVar200._0_12_ = auVar157._0_12_;
  auVar200._12_2_ = sVar213;
  auVar200._14_2_ = uVar76;
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._0_10_ = auVar157._0_10_;
  auVar199._10_2_ = uVar75;
  sVar208 = auVar157._4_2_;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._0_8_ = auVar157._0_8_;
  auVar198._8_2_ = sVar208;
  auVar84._4_8_ = auVar198._8_8_;
  auVar84._2_2_ = uVar74;
  sVar203 = auVar157._2_2_;
  auVar84._0_2_ = sVar203;
  sVar193 = auVar157._0_2_;
  auVar184._0_8_ = auVar286._0_8_;
  auVar184._8_4_ = auVar81._0_4_;
  auVar184._12_4_ = auVar82._0_4_;
  auVar262._8_4_ = auVar83._0_4_;
  auVar262._12_4_ = auVar84._0_4_;
  auVar280._8_8_ = auVar262._8_8_;
  auVar280._0_8_ = auVar184._8_8_;
  auVar290._0_8_ = CONCAT44(auVar266._8_4_,auVar287._8_4_);
  auVar290._8_4_ = auVar288._12_4_;
  auVar290._12_4_ = auVar132._12_4_;
  auVar184 = *(undefined1 (*) [16])blimit1;
  auVar263 = ZEXT416(bd - 8);
  auVar182._0_8_ = CONCAT44(auVar198._8_4_,auVar179._8_4_);
  auVar182._8_4_ = auVar180._12_4_;
  auVar182._12_4_ = auVar199._12_4_;
  auVar297._8_8_ = auVar182._0_8_;
  auVar297._0_8_ = auVar290._0_8_;
  auVar291._8_8_ = auVar182._8_8_;
  auVar291._0_8_ = auVar290._8_8_;
  auVar279 = *(undefined1 (*) [16])limit0;
  sVar281 = auVar112._8_2_;
  sVar282 = auVar112._10_2_;
  auVar275._0_8_ = CONCAT26(uVar54,CONCAT24(sVar282,CONCAT22(uVar53,sVar281)));
  sVar283 = auVar112._12_2_;
  auVar275._8_2_ = sVar283;
  auVar275._10_2_ = uVar55;
  sVar284 = auVar112._14_2_;
  auVar276._12_2_ = sVar284;
  auVar276._0_12_ = auVar275;
  auVar276._14_2_ = uVar56;
  auVar112 = *(undefined1 (*) [16])limit1;
  sVar151 = auVar113._8_2_;
  sVar152 = auVar113._10_2_;
  auVar146._0_8_ = CONCAT26(uVar62,CONCAT24(sVar152,CONCAT22(uVar61,sVar151)));
  sVar153 = auVar113._12_2_;
  auVar146._8_2_ = sVar153;
  auVar146._10_2_ = uVar63;
  sVar154 = auVar113._14_2_;
  auVar147._12_2_ = sVar154;
  auVar147._0_12_ = auVar146;
  auVar147._14_2_ = uVar64;
  sVar119 = auVar134._8_2_;
  sVar121 = auVar134._10_2_;
  auVar111._0_8_ = CONCAT26(uVar70,CONCAT24(sVar121,CONCAT22(uVar69,sVar119)));
  sVar123 = auVar134._12_2_;
  auVar111._8_2_ = sVar123;
  auVar111._10_2_ = uVar71;
  sVar125 = auVar134._14_2_;
  auVar134._12_2_ = sVar125;
  auVar134._0_12_ = auVar111;
  auVar134._14_2_ = uVar72;
  sVar240 = auVar157._8_2_;
  sVar241 = auVar157._10_2_;
  auVar235._0_8_ = CONCAT26(uVar78,CONCAT24(sVar241,CONCAT22(uVar77,sVar240)));
  sVar242 = auVar157._12_2_;
  auVar235._8_2_ = sVar242;
  auVar235._10_2_ = uVar79;
  sVar243 = auVar157._14_2_;
  auVar237._12_2_ = sVar243;
  auVar237._0_12_ = auVar235;
  auVar237._14_2_ = uVar80;
  auVar264._8_4_ = (int)((ulong)auVar275._0_8_ >> 0x20);
  auVar264._0_8_ = auVar275._0_8_;
  auVar264._12_4_ = (int)((ulong)auVar146._0_8_ >> 0x20);
  auVar201._4_4_ = CONCAT22(uVar61,sVar151);
  auVar201._0_4_ = CONCAT22(uVar53,sVar281);
  auVar156._8_4_ = (int)((ulong)auVar111._0_8_ >> 0x20);
  auVar156._0_8_ = auVar111._0_8_;
  auVar156._12_4_ = (int)((ulong)auVar235._0_8_ >> 0x20);
  auVar201._12_4_ = CONCAT22(uVar77,sVar240);
  auVar201._8_4_ = CONCAT22(uVar69,sVar119);
  auVar265._8_8_ = auVar156._8_8_;
  auVar265._0_8_ = auVar264._8_8_;
  auVar113 = *(undefined1 (*) [16])thresh0;
  auVar277._0_8_ = CONCAT44(auVar146._8_4_,auVar275._8_4_);
  auVar277._8_4_ = auVar276._12_4_;
  auVar277._12_4_ = auVar147._12_4_;
  auVar157._0_8_ = CONCAT44(auVar235._8_4_,auVar111._8_4_);
  auVar157._8_4_ = auVar134._12_4_;
  auVar157._12_4_ = auVar237._12_4_;
  auVar238._8_8_ = auVar157._0_8_;
  auVar238._0_8_ = auVar277._0_8_;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar250._0_13_;
  auVar2[0xe] = auVar250[7];
  auVar8[0xc] = auVar250[6];
  auVar8._0_12_ = auVar250._0_12_;
  auVar8._13_2_ = auVar2._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar250._0_11_;
  auVar14._12_3_ = auVar8._12_3_;
  auVar20[10] = auVar250[5];
  auVar20._0_10_ = auVar250._0_10_;
  auVar20._11_4_ = auVar14._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar250._0_9_;
  auVar26._10_5_ = auVar20._10_5_;
  auVar32[8] = auVar250[4];
  auVar32._0_8_ = auVar250._0_8_;
  auVar32._9_6_ = auVar26._9_6_;
  auVar85._7_8_ = 0;
  auVar85._0_7_ = auVar32._8_7_;
  auVar95._1_8_ = SUB158(auVar85 << 0x40,7);
  auVar95[0] = auVar250[3];
  auVar95._9_6_ = 0;
  auVar96._1_10_ = SUB1510(auVar95 << 0x30,5);
  auVar96[0] = auVar250[2];
  auVar96._11_4_ = 0;
  auVar38[2] = auVar250[1];
  auVar38._0_2_ = auVar250._0_2_;
  auVar38._3_12_ = SUB1512(auVar96 << 0x20,3);
  auVar43._2_13_ = auVar38._2_13_;
  auVar43._0_2_ = auVar250._0_2_ & 0xff;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar184._0_13_;
  auVar3[0xe] = auVar184[7];
  auVar9[0xc] = auVar184[6];
  auVar9._0_12_ = auVar184._0_12_;
  auVar9._13_2_ = auVar3._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar184._0_11_;
  auVar15._12_3_ = auVar9._12_3_;
  auVar21[10] = auVar184[5];
  auVar21._0_10_ = auVar184._0_10_;
  auVar21._11_4_ = auVar15._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar184._0_9_;
  auVar27._10_5_ = auVar21._10_5_;
  auVar33[8] = auVar184[4];
  auVar33._0_8_ = auVar184._0_8_;
  auVar33._9_6_ = auVar27._9_6_;
  auVar86._7_8_ = 0;
  auVar86._0_7_ = auVar33._8_7_;
  auVar97._1_8_ = SUB158(auVar86 << 0x40,7);
  auVar97[0] = auVar184[3];
  auVar97._9_6_ = 0;
  auVar98._1_10_ = SUB1510(auVar97 << 0x30,5);
  auVar98[0] = auVar184[2];
  auVar98._11_4_ = 0;
  auVar39[2] = auVar184[1];
  auVar39._0_2_ = auVar184._0_2_;
  auVar39._3_12_ = SUB1512(auVar98 << 0x20,3);
  auVar44._2_13_ = auVar39._2_13_;
  auVar44._0_2_ = auVar184._0_2_ & 0xff;
  auVar249._0_8_ = auVar43._0_8_;
  auVar249._8_8_ = auVar44._0_8_;
  auVar250 = psllw(auVar249,auVar263);
  auVar278._8_8_ = auVar157._8_8_;
  auVar278._0_8_ = auVar277._8_8_;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar279._0_13_;
  auVar4[0xe] = auVar279[7];
  auVar10[0xc] = auVar279[6];
  auVar10._0_12_ = auVar279._0_12_;
  auVar10._13_2_ = auVar4._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar279._0_11_;
  auVar16._12_3_ = auVar10._12_3_;
  auVar22[10] = auVar279[5];
  auVar22._0_10_ = auVar279._0_10_;
  auVar22._11_4_ = auVar16._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar279._0_9_;
  auVar28._10_5_ = auVar22._10_5_;
  auVar34[8] = auVar279[4];
  auVar34._0_8_ = auVar279._0_8_;
  auVar34._9_6_ = auVar28._9_6_;
  auVar87._7_8_ = 0;
  auVar87._0_7_ = auVar34._8_7_;
  auVar99._1_8_ = SUB158(auVar87 << 0x40,7);
  auVar99[0] = auVar279[3];
  auVar99._9_6_ = 0;
  auVar100._1_10_ = SUB1510(auVar99 << 0x30,5);
  auVar100[0] = auVar279[2];
  auVar100._11_4_ = 0;
  auVar45._3_12_ = SUB1512(auVar100 << 0x20,3);
  auVar45[2] = auVar279[1];
  auVar45[1] = 0;
  auVar45[0] = auVar279[0];
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar112._0_13_;
  auVar5[0xe] = auVar112[7];
  auVar11[0xc] = auVar112[6];
  auVar11._0_12_ = auVar112._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar112._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar112[5];
  auVar23._0_10_ = auVar112._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar112._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar112[4];
  auVar35._0_8_ = auVar112._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar88._7_8_ = 0;
  auVar88._0_7_ = auVar35._8_7_;
  auVar101._1_8_ = SUB158(auVar88 << 0x40,7);
  auVar101[0] = auVar112[3];
  auVar101._9_6_ = 0;
  auVar102._1_10_ = SUB1510(auVar101 << 0x30,5);
  auVar102[0] = auVar112[2];
  auVar102._11_4_ = 0;
  auVar40[2] = auVar112[1];
  auVar40._0_2_ = auVar112._0_2_;
  auVar40._3_12_ = SUB1512(auVar102 << 0x20,3);
  auVar46._2_13_ = auVar40._2_13_;
  auVar46._0_2_ = auVar112._0_2_ & 0xff;
  auVar183._0_8_ = auVar45._0_8_;
  auVar183._8_8_ = auVar46._0_8_;
  auVar184 = psllw(auVar183,auVar263);
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar113._0_13_;
  auVar6[0xe] = auVar113[7];
  auVar12[0xc] = auVar113[6];
  auVar12._0_12_ = auVar113._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar113._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar113[5];
  auVar24._0_10_ = auVar113._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar113._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar113[4];
  auVar36._0_8_ = auVar113._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar89._7_8_ = 0;
  auVar89._0_7_ = auVar36._8_7_;
  auVar103._1_8_ = SUB158(auVar89 << 0x40,7);
  auVar103[0] = auVar113[3];
  auVar103._9_6_ = 0;
  auVar104._1_10_ = SUB1510(auVar103 << 0x30,5);
  auVar104[0] = auVar113[2];
  auVar104._11_4_ = 0;
  auVar41[2] = auVar113[1];
  auVar41._0_2_ = auVar113._0_2_;
  auVar41._3_12_ = SUB1512(auVar104 << 0x20,3);
  auVar47._2_13_ = auVar41._2_13_;
  auVar47._0_2_ = auVar113._0_2_ & 0xff;
  auVar112 = *(undefined1 (*) [16])thresh1;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar112._0_13_;
  auVar7[0xe] = auVar112[7];
  auVar13[0xc] = auVar112[6];
  auVar13._0_12_ = auVar112._0_12_;
  auVar13._13_2_ = auVar7._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar112._0_11_;
  auVar19._12_3_ = auVar13._12_3_;
  auVar25[10] = auVar112[5];
  auVar25._0_10_ = auVar112._0_10_;
  auVar25._11_4_ = auVar19._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar112._0_9_;
  auVar31._10_5_ = auVar25._10_5_;
  auVar37[8] = auVar112[4];
  auVar37._0_8_ = auVar112._0_8_;
  auVar37._9_6_ = auVar31._9_6_;
  auVar90._7_8_ = 0;
  auVar90._0_7_ = auVar37._8_7_;
  auVar105._1_8_ = SUB158(auVar90 << 0x40,7);
  auVar105[0] = auVar112[3];
  auVar105._9_6_ = 0;
  auVar106._1_10_ = SUB1510(auVar105 << 0x30,5);
  auVar106[0] = auVar112[2];
  auVar106._11_4_ = 0;
  auVar42[2] = auVar112[1];
  auVar42._0_2_ = auVar112._0_2_;
  auVar42._3_12_ = SUB1512(auVar106 << 0x20,3);
  auVar48._2_13_ = auVar42._2_13_;
  auVar48._0_2_ = auVar112._0_2_ & 0xff;
  auVar257._0_8_ = auVar47._0_8_;
  auVar257._8_8_ = auVar48._0_8_;
  auVar112 = psubusw(auVar291,auVar201);
  auVar134 = psubusw(auVar201,auVar291);
  auVar113 = psubusw(auVar297,auVar265);
  auVar157 = psubusw(auVar265,auVar297);
  auVar157 = auVar157 | auVar113;
  auVar112 = paddusw(auVar134 | auVar112,auVar134 | auVar112);
  auVar158._0_2_ = auVar157._0_2_ >> 1;
  auVar158._2_2_ = auVar157._2_2_ >> 1;
  auVar158._4_2_ = auVar157._4_2_ >> 1;
  auVar158._6_2_ = auVar157._6_2_ >> 1;
  auVar158._8_2_ = auVar157._8_2_ >> 1;
  auVar158._10_2_ = auVar157._10_2_ >> 1;
  auVar158._12_2_ = auVar157._12_2_ >> 1;
  auVar158._14_2_ = auVar157._14_2_ >> 1;
  auVar112 = paddusw(auVar158,auVar112);
  auVar112 = auVar112 ^ _DAT_004dcf60;
  auVar250 = auVar250 ^ _DAT_004dcf60;
  auVar159._0_2_ = -(ushort)(auVar250._0_2_ < auVar112._0_2_);
  auVar159._2_2_ = -(ushort)(auVar250._2_2_ < auVar112._2_2_);
  auVar159._4_2_ = -(ushort)(auVar250._4_2_ < auVar112._4_2_);
  auVar159._6_2_ = -(ushort)(auVar250._6_2_ < auVar112._6_2_);
  auVar159._8_2_ = -(ushort)(auVar250._8_2_ < auVar112._8_2_);
  auVar159._10_2_ = -(ushort)(auVar250._10_2_ < auVar112._10_2_);
  auVar159._12_2_ = -(ushort)(auVar250._12_2_ < auVar112._12_2_);
  auVar159._14_2_ = -(ushort)(auVar250._14_2_ < auVar112._14_2_);
  auVar134 = paddusw(auVar184,_DAT_00517600);
  auVar134 = auVar134 & auVar159;
  auVar112._4_2_ = sVar129;
  auVar112._0_4_ = auVar286._0_4_;
  auVar112._6_2_ = uVar57;
  auVar112._8_2_ = sVar178;
  auVar112._10_2_ = uVar65;
  auVar112._12_2_ = sVar193;
  auVar112._14_2_ = uVar73;
  auVar113 = psubusw(auVar112,auVar280);
  auVar250 = psubusw(auVar280,auVar112);
  auVar250 = auVar250 | auVar113;
  auVar113 = psubusw(auVar280,auVar297);
  auVar157 = psubusw(auVar297,auVar280);
  auVar157 = auVar157 | auVar113;
  sVar130 = auVar250._0_2_;
  sVar137 = auVar157._0_2_;
  uVar155 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar250._2_2_;
  sVar137 = auVar157._2_2_;
  uVar166 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar250._4_2_;
  sVar137 = auVar157._4_2_;
  uVar167 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar250._6_2_;
  sVar137 = auVar157._6_2_;
  uVar168 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar250._8_2_;
  sVar137 = auVar157._8_2_;
  uVar169 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar250._10_2_;
  sVar137 = auVar157._10_2_;
  uVar170 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar250._12_2_;
  sVar137 = auVar157._12_2_;
  sVar139 = auVar157._14_2_;
  uVar171 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar250._14_2_;
  uVar172 = (ushort)(sVar139 < sVar130) * sVar130 | (ushort)(sVar139 >= sVar130) * sVar139;
  auVar113 = psubusw(auVar297,auVar291);
  auVar157 = psubusw(auVar291,auVar297);
  auVar157 = auVar157 | auVar113;
  auVar113 = psubusw(auVar265,auVar201);
  auVar250 = psubusw(auVar201,auVar265);
  auVar250 = auVar250 | auVar113;
  sVar130 = auVar157._0_2_;
  sVar137 = auVar250._0_2_;
  auVar251._0_2_ = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._2_2_;
  sVar137 = auVar250._2_2_;
  auVar251._2_2_ = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._4_2_;
  sVar137 = auVar250._4_2_;
  auVar251._4_2_ = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._6_2_;
  sVar137 = auVar250._6_2_;
  auVar251._6_2_ = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._8_2_;
  sVar137 = auVar250._8_2_;
  auVar251._8_2_ = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._10_2_;
  sVar137 = auVar250._10_2_;
  auVar251._10_2_ = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._12_2_;
  sVar137 = auVar250._12_2_;
  sVar139 = auVar250._14_2_;
  auVar251._12_2_ = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._14_2_;
  auVar251._14_2_ = (ushort)(sVar139 < sVar130) * sVar130 | (ushort)(sVar139 >= sVar130) * sVar139;
  auVar113 = psubusw(auVar238,auVar265);
  auVar157 = psubusw(auVar265,auVar238);
  auVar157 = auVar157 | auVar113;
  auVar250 = psubusw(auVar238,auVar278);
  auVar113 = psubusw(auVar278,auVar238);
  auVar113 = auVar113 | auVar250;
  sVar130 = auVar157._0_2_;
  sVar137 = auVar113._0_2_;
  uVar110 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._2_2_;
  sVar137 = auVar113._2_2_;
  uVar116 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._4_2_;
  sVar137 = auVar113._4_2_;
  uVar117 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._6_2_;
  sVar137 = auVar113._6_2_;
  uVar118 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._8_2_;
  sVar137 = auVar113._8_2_;
  uVar120 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._10_2_;
  sVar137 = auVar113._10_2_;
  uVar122 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._12_2_;
  sVar137 = auVar113._12_2_;
  sVar139 = auVar113._14_2_;
  uVar124 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar157._14_2_;
  uVar126 = (ushort)(sVar139 < sVar130) * sVar130 | (ushort)(sVar139 >= sVar130) * sVar139;
  uVar155 = ((short)uVar155 < (short)auVar251._0_2_) * auVar251._0_2_ |
            ((short)uVar155 >= (short)auVar251._0_2_) * uVar155;
  uVar166 = ((short)uVar166 < (short)auVar251._2_2_) * auVar251._2_2_ |
            ((short)uVar166 >= (short)auVar251._2_2_) * uVar166;
  uVar167 = ((short)uVar167 < (short)auVar251._4_2_) * auVar251._4_2_ |
            ((short)uVar167 >= (short)auVar251._4_2_) * uVar167;
  uVar168 = ((short)uVar168 < (short)auVar251._6_2_) * auVar251._6_2_ |
            ((short)uVar168 >= (short)auVar251._6_2_) * uVar168;
  uVar169 = ((short)uVar169 < (short)auVar251._8_2_) * auVar251._8_2_ |
            ((short)uVar169 >= (short)auVar251._8_2_) * uVar169;
  uVar170 = ((short)uVar170 < (short)auVar251._10_2_) * auVar251._10_2_ |
            ((short)uVar170 >= (short)auVar251._10_2_) * uVar170;
  uVar171 = ((short)uVar171 < (short)auVar251._12_2_) * auVar251._12_2_ |
            ((short)uVar171 >= (short)auVar251._12_2_) * uVar171;
  uVar172 = ((short)uVar172 < (short)auVar251._14_2_) * auVar251._14_2_ |
            ((short)uVar172 >= (short)auVar251._14_2_) * uVar172;
  uVar110 = ((short)uVar110 < (short)uVar155) * uVar155 |
            ((short)uVar110 >= (short)uVar155) * uVar110;
  uVar116 = ((short)uVar116 < (short)uVar166) * uVar166 |
            ((short)uVar116 >= (short)uVar166) * uVar116;
  uVar117 = ((short)uVar117 < (short)uVar167) * uVar167 |
            ((short)uVar117 >= (short)uVar167) * uVar117;
  uVar118 = ((short)uVar118 < (short)uVar168) * uVar168 |
            ((short)uVar118 >= (short)uVar168) * uVar118;
  uVar120 = ((short)uVar120 < (short)uVar169) * uVar169 |
            ((short)uVar120 >= (short)uVar169) * uVar120;
  uVar122 = ((short)uVar122 < (short)uVar170) * uVar170 |
            ((short)uVar122 >= (short)uVar170) * uVar122;
  uVar124 = ((short)uVar124 < (short)uVar171) * uVar171 |
            ((short)uVar124 >= (short)uVar171) * uVar124;
  uVar126 = ((short)uVar126 < (short)uVar172) * uVar172 |
            ((short)uVar126 >= (short)uVar172) * uVar126;
  sVar130 = auVar134._0_2_;
  auVar113._0_2_ =
       (ushort)((short)uVar110 < sVar130) * sVar130 | ((short)uVar110 >= sVar130) * uVar110;
  sVar130 = auVar134._2_2_;
  auVar113._2_2_ =
       (ushort)((short)uVar116 < sVar130) * sVar130 | ((short)uVar116 >= sVar130) * uVar116;
  sVar130 = auVar134._4_2_;
  auVar113._4_2_ =
       (ushort)((short)uVar117 < sVar130) * sVar130 | ((short)uVar117 >= sVar130) * uVar117;
  sVar130 = auVar134._6_2_;
  auVar113._6_2_ =
       (ushort)((short)uVar118 < sVar130) * sVar130 | ((short)uVar118 >= sVar130) * uVar118;
  sVar130 = auVar134._8_2_;
  auVar113._8_2_ =
       (ushort)((short)uVar120 < sVar130) * sVar130 | ((short)uVar120 >= sVar130) * uVar120;
  sVar130 = auVar134._10_2_;
  auVar113._10_2_ =
       (ushort)((short)uVar122 < sVar130) * sVar130 | ((short)uVar122 >= sVar130) * uVar122;
  sVar130 = auVar134._12_2_;
  auVar113._12_2_ =
       (ushort)((short)uVar124 < sVar130) * sVar130 | ((short)uVar124 >= sVar130) * uVar124;
  sVar130 = auVar134._14_2_;
  auVar113._14_2_ =
       (ushort)((short)uVar126 < sVar130) * sVar130 | ((short)uVar126 >= sVar130) * uVar126;
  auVar113 = auVar113 ^ _DAT_004dcf60;
  auVar184 = auVar184 ^ _DAT_004dcf60;
  auVar250._0_2_ = -(ushort)(auVar184._0_2_ < auVar113._0_2_);
  auVar250._2_2_ = -(ushort)(auVar184._2_2_ < auVar113._2_2_);
  auVar250._4_2_ = -(ushort)(auVar184._4_2_ < auVar113._4_2_);
  auVar250._6_2_ = -(ushort)(auVar184._6_2_ < auVar113._6_2_);
  auVar250._8_2_ = -(ushort)(auVar184._8_2_ < auVar113._8_2_);
  auVar250._10_2_ = -(ushort)(auVar184._10_2_ < auVar113._10_2_);
  auVar250._12_2_ = -(ushort)(auVar184._12_2_ < auVar113._12_2_);
  auVar250._14_2_ = -(ushort)(auVar184._14_2_ < auVar113._14_2_);
  auVar184 = psllw(_DAT_00517600,ZEXT416((uint)bd));
  auVar113 = psubusw(auVar280,auVar291);
  auVar134 = psubusw(auVar291,auVar280);
  auVar134 = auVar134 | auVar113;
  auVar113 = psubusw(auVar238,auVar201);
  auVar157 = psubusw(auVar201,auVar238);
  auVar157 = auVar157 | auVar113;
  auVar113 = psllw(auVar257,auVar263);
  sVar130 = auVar134._0_2_;
  sVar137 = auVar157._0_2_;
  uVar110 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar134._2_2_;
  sVar137 = auVar157._2_2_;
  uVar116 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar134._4_2_;
  sVar137 = auVar157._4_2_;
  uVar117 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar134._6_2_;
  sVar137 = auVar157._6_2_;
  uVar118 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar134._8_2_;
  sVar137 = auVar157._8_2_;
  uVar120 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar134._10_2_;
  sVar137 = auVar157._10_2_;
  uVar122 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar134._12_2_;
  sVar137 = auVar157._12_2_;
  sVar139 = auVar157._14_2_;
  uVar124 = (ushort)(sVar137 < sVar130) * sVar130 | (ushort)(sVar137 >= sVar130) * sVar137;
  sVar130 = auVar134._14_2_;
  uVar126 = (ushort)(sVar139 < sVar130) * sVar130 | (ushort)(sVar139 >= sVar130) * sVar139;
  uVar110 = ((short)uVar110 < (short)auVar251._0_2_) * auVar251._0_2_ |
            ((short)uVar110 >= (short)auVar251._0_2_) * uVar110;
  uVar116 = ((short)uVar116 < (short)auVar251._2_2_) * auVar251._2_2_ |
            ((short)uVar116 >= (short)auVar251._2_2_) * uVar116;
  uVar117 = ((short)uVar117 < (short)auVar251._4_2_) * auVar251._4_2_ |
            ((short)uVar117 >= (short)auVar251._4_2_) * uVar117;
  uVar118 = ((short)uVar118 < (short)auVar251._6_2_) * auVar251._6_2_ |
            ((short)uVar118 >= (short)auVar251._6_2_) * uVar118;
  uVar120 = ((short)uVar120 < (short)auVar251._8_2_) * auVar251._8_2_ |
            ((short)uVar120 >= (short)auVar251._8_2_) * uVar120;
  uVar122 = ((short)uVar122 < (short)auVar251._10_2_) * auVar251._10_2_ |
            ((short)uVar122 >= (short)auVar251._10_2_) * uVar122;
  uVar124 = ((short)uVar124 < (short)auVar251._12_2_) * auVar251._12_2_ |
            ((short)uVar124 >= (short)auVar251._12_2_) * uVar124;
  uVar126 = ((short)uVar126 < (short)auVar251._14_2_) * auVar251._14_2_ |
            ((short)uVar126 >= (short)auVar251._14_2_) * uVar126;
  auVar251 = auVar251 ^ _DAT_004dcf60;
  auVar113 = auVar113 ^ _DAT_004dcf60;
  auVar252._0_2_ = -(ushort)(auVar113._0_2_ < auVar251._0_2_);
  auVar252._2_2_ = -(ushort)(auVar113._2_2_ < auVar251._2_2_);
  auVar252._4_2_ = -(ushort)(auVar113._4_2_ < auVar251._4_2_);
  auVar252._6_2_ = -(ushort)(auVar113._6_2_ < auVar251._6_2_);
  auVar252._8_2_ = -(ushort)(auVar113._8_2_ < auVar251._8_2_);
  auVar252._10_2_ = -(ushort)(auVar113._10_2_ < auVar251._10_2_);
  auVar252._12_2_ = -(ushort)(auVar113._12_2_ < auVar251._12_2_);
  auVar252._14_2_ = -(ushort)(auVar113._14_2_ < auVar251._14_2_);
  auVar113 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar113 = pshuflw(auVar113,auVar113,0);
  uVar131 = auVar113._0_4_;
  auVar202._4_4_ = uVar131;
  auVar202._0_4_ = uVar131;
  auVar202._8_4_ = uVar131;
  auVar202._12_4_ = uVar131;
  auVar134 = psubsw(auVar291,auVar202);
  auVar113 = psubsw(auVar297,auVar202);
  auVar258 = psubsw(auVar201,auVar202);
  auVar266 = psubsw(auVar265,auVar202);
  auVar279._8_4_ = 0xffffffff;
  auVar279._0_8_ = 0xffffffffffffffff;
  auVar279._12_4_ = 0xffffffff;
  auVar157 = paddsw(auVar184,auVar279);
  auVar279 = psubsw(auVar157,auVar202);
  auVar184 = psubsw((undefined1  [16])0x0,auVar202);
  auVar157 = psubsw(auVar113,auVar266);
  sVar195 = auVar279._0_2_;
  sVar130 = auVar157._0_2_;
  uVar155 = (ushort)(sVar195 < sVar130) * sVar195 | (ushort)(sVar195 >= sVar130) * sVar130;
  sVar196 = auVar279._2_2_;
  sVar130 = auVar157._2_2_;
  uVar166 = (ushort)(sVar196 < sVar130) * sVar196 | (ushort)(sVar196 >= sVar130) * sVar130;
  sVar197 = auVar279._4_2_;
  sVar130 = auVar157._4_2_;
  uVar167 = (ushort)(sVar197 < sVar130) * sVar197 | (ushort)(sVar197 >= sVar130) * sVar130;
  sVar204 = auVar279._6_2_;
  sVar130 = auVar157._6_2_;
  uVar168 = (ushort)(sVar204 < sVar130) * sVar204 | (ushort)(sVar204 >= sVar130) * sVar130;
  sVar205 = auVar279._8_2_;
  sVar130 = auVar157._8_2_;
  uVar169 = (ushort)(sVar205 < sVar130) * sVar205 | (ushort)(sVar205 >= sVar130) * sVar130;
  sVar206 = auVar279._10_2_;
  sVar130 = auVar157._10_2_;
  uVar170 = (ushort)(sVar206 < sVar130) * sVar206 | (ushort)(sVar206 >= sVar130) * sVar130;
  sVar207 = auVar279._12_2_;
  sVar130 = auVar157._12_2_;
  sVar137 = auVar157._14_2_;
  uVar171 = (ushort)(sVar207 < sVar130) * sVar207 | (ushort)(sVar207 >= sVar130) * sVar130;
  sVar209 = auVar279._14_2_;
  uVar172 = (ushort)(sVar209 < sVar137) * sVar209 | (ushort)(sVar209 >= sVar137) * sVar137;
  sVar130 = auVar184._0_2_;
  auVar185._0_2_ =
       (ushort)((short)uVar155 < sVar130) * sVar130 | ((short)uVar155 >= sVar130) * uVar155;
  sVar139 = auVar184._2_2_;
  auVar185._2_2_ =
       (ushort)((short)uVar166 < sVar139) * sVar139 | ((short)uVar166 >= sVar139) * uVar166;
  sVar141 = auVar184._4_2_;
  auVar185._4_2_ =
       (ushort)((short)uVar167 < sVar141) * sVar141 | ((short)uVar167 >= sVar141) * uVar167;
  sVar142 = auVar184._6_2_;
  auVar185._6_2_ =
       (ushort)((short)uVar168 < sVar142) * sVar142 | ((short)uVar168 >= sVar142) * uVar168;
  sVar143 = auVar184._8_2_;
  auVar185._8_2_ =
       (ushort)((short)uVar169 < sVar143) * sVar143 | ((short)uVar169 >= sVar143) * uVar169;
  sVar144 = auVar184._10_2_;
  auVar185._10_2_ =
       (ushort)((short)uVar170 < sVar144) * sVar144 | ((short)uVar170 >= sVar144) * uVar170;
  sVar145 = auVar184._12_2_;
  auVar185._12_2_ =
       (ushort)((short)uVar171 < sVar145) * sVar145 | ((short)uVar171 >= sVar145) * uVar171;
  sVar194 = auVar184._14_2_;
  auVar185._14_2_ =
       (ushort)((short)uVar172 < sVar194) * sVar194 | ((short)uVar172 >= sVar194) * uVar172;
  auVar184 = psubsw(auVar258,auVar134);
  auVar157 = paddsw(auVar185 & auVar252,auVar184);
  auVar157 = paddsw(auVar157,auVar184);
  auVar157 = paddsw(auVar157,auVar184);
  sVar137 = auVar157._0_2_;
  uVar155 = (ushort)(sVar195 < sVar137) * sVar195 | (ushort)(sVar195 >= sVar137) * sVar137;
  sVar137 = auVar157._2_2_;
  uVar166 = (ushort)(sVar196 < sVar137) * sVar196 | (ushort)(sVar196 >= sVar137) * sVar137;
  sVar137 = auVar157._4_2_;
  uVar167 = (ushort)(sVar197 < sVar137) * sVar197 | (ushort)(sVar197 >= sVar137) * sVar137;
  sVar137 = auVar157._6_2_;
  uVar168 = (ushort)(sVar204 < sVar137) * sVar204 | (ushort)(sVar204 >= sVar137) * sVar137;
  sVar137 = auVar157._8_2_;
  uVar169 = (ushort)(sVar205 < sVar137) * sVar205 | (ushort)(sVar205 >= sVar137) * sVar137;
  sVar137 = auVar157._10_2_;
  uVar170 = (ushort)(sVar206 < sVar137) * sVar206 | (ushort)(sVar206 >= sVar137) * sVar137;
  sVar137 = auVar157._12_2_;
  sVar210 = auVar157._14_2_;
  uVar171 = (ushort)(sVar207 < sVar137) * sVar207 | (ushort)(sVar207 >= sVar137) * sVar137;
  uVar172 = (ushort)(sVar209 < sVar210) * sVar209 | (ushort)(sVar209 >= sVar210) * sVar210;
  auVar186._0_2_ =
       (ushort)((short)uVar155 < sVar130) * sVar130 | ((short)uVar155 >= sVar130) * uVar155;
  auVar186._2_2_ =
       (ushort)((short)uVar166 < sVar139) * sVar139 | ((short)uVar166 >= sVar139) * uVar166;
  auVar186._4_2_ =
       (ushort)((short)uVar167 < sVar141) * sVar141 | ((short)uVar167 >= sVar141) * uVar167;
  auVar186._6_2_ =
       (ushort)((short)uVar168 < sVar142) * sVar142 | ((short)uVar168 >= sVar142) * uVar168;
  auVar186._8_2_ =
       (ushort)((short)uVar169 < sVar143) * sVar143 | ((short)uVar169 >= sVar143) * uVar169;
  auVar186._10_2_ =
       (ushort)((short)uVar170 < sVar144) * sVar144 | ((short)uVar170 >= sVar144) * uVar170;
  auVar186._12_2_ =
       (ushort)((short)uVar171 < sVar145) * sVar145 | ((short)uVar171 >= sVar145) * uVar171;
  auVar186._14_2_ =
       (ushort)((short)uVar172 < sVar194) * sVar194 | ((short)uVar172 >= sVar194) * uVar172;
  auVar157 = psubusw(auVar112,auVar291);
  auVar112 = psubusw(auVar291,auVar112);
  auVar112 = auVar112 | auVar157;
  auVar184 = psubusw(auVar278,auVar201);
  auVar157 = psubusw(auVar201,auVar278);
  auVar157 = auVar157 | auVar184;
  sVar137 = auVar112._0_2_;
  sVar210 = auVar157._0_2_;
  uVar155 = (ushort)(sVar210 < sVar137) * sVar137 | (ushort)(sVar210 >= sVar137) * sVar210;
  sVar137 = auVar112._2_2_;
  sVar210 = auVar157._2_2_;
  uVar166 = (ushort)(sVar210 < sVar137) * sVar137 | (ushort)(sVar210 >= sVar137) * sVar210;
  sVar137 = auVar112._4_2_;
  sVar210 = auVar157._4_2_;
  uVar167 = (ushort)(sVar210 < sVar137) * sVar137 | (ushort)(sVar210 >= sVar137) * sVar210;
  sVar137 = auVar112._6_2_;
  sVar210 = auVar157._6_2_;
  uVar168 = (ushort)(sVar210 < sVar137) * sVar137 | (ushort)(sVar210 >= sVar137) * sVar210;
  sVar137 = auVar112._8_2_;
  sVar210 = auVar157._8_2_;
  uVar169 = (ushort)(sVar210 < sVar137) * sVar137 | (ushort)(sVar210 >= sVar137) * sVar210;
  sVar137 = auVar112._10_2_;
  sVar210 = auVar157._10_2_;
  uVar170 = (ushort)(sVar210 < sVar137) * sVar137 | (ushort)(sVar210 >= sVar137) * sVar210;
  sVar137 = auVar112._12_2_;
  sVar210 = auVar157._12_2_;
  sVar211 = auVar157._14_2_;
  uVar171 = (ushort)(sVar210 < sVar137) * sVar137 | (ushort)(sVar210 >= sVar137) * sVar210;
  sVar137 = auVar112._14_2_;
  uVar172 = (ushort)(sVar211 < sVar137) * sVar137 | (ushort)(sVar211 >= sVar137) * sVar211;
  auVar112 = psllw(_DAT_00517600,auVar263);
  auVar187._0_2_ =
       ((short)uVar155 < (short)uVar110) * uVar110 | ((short)uVar155 >= (short)uVar110) * uVar155;
  auVar187._2_2_ =
       ((short)uVar166 < (short)uVar116) * uVar116 | ((short)uVar166 >= (short)uVar116) * uVar166;
  auVar187._4_2_ =
       ((short)uVar167 < (short)uVar117) * uVar117 | ((short)uVar167 >= (short)uVar117) * uVar167;
  auVar187._6_2_ =
       ((short)uVar168 < (short)uVar118) * uVar118 | ((short)uVar168 >= (short)uVar118) * uVar168;
  auVar187._8_2_ =
       ((short)uVar169 < (short)uVar120) * uVar120 | ((short)uVar169 >= (short)uVar120) * uVar169;
  auVar187._10_2_ =
       ((short)uVar170 < (short)uVar122) * uVar122 | ((short)uVar170 >= (short)uVar122) * uVar170;
  auVar187._12_2_ =
       ((short)uVar171 < (short)uVar124) * uVar124 | ((short)uVar171 >= (short)uVar124) * uVar171;
  auVar187._14_2_ =
       ((short)uVar172 < (short)uVar126) * uVar126 | ((short)uVar172 >= (short)uVar126) * uVar172;
  auVar187 = auVar187 ^ _DAT_004dcf60;
  auVar112 = auVar112 ^ _DAT_004dcf60;
  auVar188._0_2_ = -(ushort)(auVar112._0_2_ < auVar187._0_2_);
  auVar188._2_2_ = -(ushort)(auVar112._2_2_ < auVar187._2_2_);
  auVar188._4_2_ = -(ushort)(auVar112._4_2_ < auVar187._4_2_);
  auVar188._6_2_ = -(ushort)(auVar112._6_2_ < auVar187._6_2_);
  auVar188._8_2_ = -(ushort)(auVar112._8_2_ < auVar187._8_2_);
  auVar188._10_2_ = -(ushort)(auVar112._10_2_ < auVar187._10_2_);
  auVar188._12_2_ = -(ushort)(auVar112._12_2_ < auVar187._12_2_);
  auVar188._14_2_ = -(ushort)(auVar112._14_2_ < auVar187._14_2_);
  auVar112 = paddsw(_DAT_0050bca0,~auVar250 & auVar186);
  auVar157 = paddsw(~auVar250 & auVar186,_DAT_00517620);
  auVar188 = auVar188 | auVar250;
  sVar137 = auVar157._0_2_;
  uVar110 = (ushort)(sVar195 < sVar137) * sVar195 | (ushort)(sVar195 >= sVar137) * sVar137;
  sVar137 = auVar157._2_2_;
  uVar116 = (ushort)(sVar196 < sVar137) * sVar196 | (ushort)(sVar196 >= sVar137) * sVar137;
  sVar137 = auVar157._4_2_;
  uVar117 = (ushort)(sVar197 < sVar137) * sVar197 | (ushort)(sVar197 >= sVar137) * sVar137;
  sVar137 = auVar157._6_2_;
  uVar118 = (ushort)(sVar204 < sVar137) * sVar204 | (ushort)(sVar204 >= sVar137) * sVar137;
  sVar137 = auVar157._8_2_;
  uVar120 = (ushort)(sVar205 < sVar137) * sVar205 | (ushort)(sVar205 >= sVar137) * sVar137;
  sVar137 = auVar157._10_2_;
  uVar122 = (ushort)(sVar206 < sVar137) * sVar206 | (ushort)(sVar206 >= sVar137) * sVar137;
  sVar137 = auVar157._12_2_;
  sVar210 = auVar157._14_2_;
  uVar124 = (ushort)(sVar207 < sVar137) * sVar207 | (ushort)(sVar207 >= sVar137) * sVar137;
  uVar126 = (ushort)(sVar209 < sVar210) * sVar209 | (ushort)(sVar209 >= sVar210) * sVar210;
  auVar298._0_2_ =
       (ushort)((short)uVar110 < sVar130) * sVar130 | ((short)uVar110 >= sVar130) * uVar110;
  auVar298._2_2_ =
       (ushort)((short)uVar116 < sVar139) * sVar139 | ((short)uVar116 >= sVar139) * uVar116;
  auVar298._4_2_ =
       (ushort)((short)uVar117 < sVar141) * sVar141 | ((short)uVar117 >= sVar141) * uVar117;
  auVar298._6_2_ =
       (ushort)((short)uVar118 < sVar142) * sVar142 | ((short)uVar118 >= sVar142) * uVar118;
  auVar298._8_2_ =
       (ushort)((short)uVar120 < sVar143) * sVar143 | ((short)uVar120 >= sVar143) * uVar120;
  auVar298._10_2_ =
       (ushort)((short)uVar122 < sVar144) * sVar144 | ((short)uVar122 >= sVar144) * uVar122;
  auVar298._12_2_ =
       (ushort)((short)uVar124 < sVar145) * sVar145 | ((short)uVar124 >= sVar145) * uVar124;
  auVar298._14_2_ =
       (ushort)((short)uVar126 < sVar194) * sVar194 | ((short)uVar126 >= sVar194) * uVar126;
  auVar157 = psraw(auVar298,3);
  auVar250 = paddsw(auVar157,auVar134);
  sVar137 = auVar112._0_2_;
  uVar110 = (ushort)(sVar195 < sVar137) * sVar195 | (ushort)(sVar195 >= sVar137) * sVar137;
  sVar137 = auVar112._2_2_;
  uVar116 = (ushort)(sVar196 < sVar137) * sVar196 | (ushort)(sVar196 >= sVar137) * sVar137;
  sVar137 = auVar112._4_2_;
  uVar117 = (ushort)(sVar197 < sVar137) * sVar197 | (ushort)(sVar197 >= sVar137) * sVar137;
  sVar137 = auVar112._6_2_;
  uVar118 = (ushort)(sVar204 < sVar137) * sVar204 | (ushort)(sVar204 >= sVar137) * sVar137;
  sVar137 = auVar112._8_2_;
  uVar120 = (ushort)(sVar205 < sVar137) * sVar205 | (ushort)(sVar205 >= sVar137) * sVar137;
  sVar137 = auVar112._10_2_;
  uVar122 = (ushort)(sVar206 < sVar137) * sVar206 | (ushort)(sVar206 >= sVar137) * sVar137;
  sVar137 = auVar112._12_2_;
  sVar210 = auVar112._14_2_;
  uVar124 = (ushort)(sVar207 < sVar137) * sVar207 | (ushort)(sVar207 >= sVar137) * sVar137;
  uVar126 = (ushort)(sVar209 < sVar210) * sVar209 | (ushort)(sVar209 >= sVar210) * sVar210;
  auVar263._0_2_ =
       (ushort)((short)uVar110 < sVar130) * sVar130 | ((short)uVar110 >= sVar130) * uVar110;
  auVar263._2_2_ =
       (ushort)((short)uVar116 < sVar139) * sVar139 | ((short)uVar116 >= sVar139) * uVar116;
  auVar263._4_2_ =
       (ushort)((short)uVar117 < sVar141) * sVar141 | ((short)uVar117 >= sVar141) * uVar117;
  auVar263._6_2_ =
       (ushort)((short)uVar118 < sVar142) * sVar142 | ((short)uVar118 >= sVar142) * uVar118;
  auVar263._8_2_ =
       (ushort)((short)uVar120 < sVar143) * sVar143 | ((short)uVar120 >= sVar143) * uVar120;
  auVar263._10_2_ =
       (ushort)((short)uVar122 < sVar144) * sVar144 | ((short)uVar122 >= sVar144) * uVar122;
  auVar263._12_2_ =
       (ushort)((short)uVar124 < sVar145) * sVar145 | ((short)uVar124 >= sVar145) * uVar124;
  auVar263._14_2_ =
       (ushort)((short)uVar126 < sVar194) * sVar194 | ((short)uVar126 >= sVar194) * uVar126;
  auVar112 = psraw(auVar263,3);
  auVar134 = psubsw(auVar258,auVar112);
  auVar258._0_2_ = auVar112._0_2_ + 1;
  auVar258._2_2_ = auVar112._2_2_ + 1;
  auVar258._4_2_ = auVar112._4_2_ + 1;
  auVar258._6_2_ = auVar112._6_2_ + 1;
  auVar258._8_2_ = auVar112._8_2_ + 1;
  auVar258._10_2_ = auVar112._10_2_ + 1;
  auVar258._12_2_ = auVar112._12_2_ + 1;
  auVar258._14_2_ = auVar112._14_2_ + 1;
  auVar112 = psraw(auVar258,1);
  auVar157 = psubsw(auVar266,~auVar252 & auVar112);
  auVar112 = paddsw(~auVar252 & auVar112,auVar113);
  sVar137 = auVar134._0_2_;
  uVar155 = (ushort)(sVar195 < sVar137) * sVar195 | (ushort)(sVar195 >= sVar137) * sVar137;
  sVar137 = auVar134._2_2_;
  uVar166 = (ushort)(sVar196 < sVar137) * sVar196 | (ushort)(sVar196 >= sVar137) * sVar137;
  sVar137 = auVar134._4_2_;
  uVar167 = (ushort)(sVar197 < sVar137) * sVar197 | (ushort)(sVar197 >= sVar137) * sVar137;
  sVar137 = auVar134._6_2_;
  uVar168 = (ushort)(sVar204 < sVar137) * sVar204 | (ushort)(sVar204 >= sVar137) * sVar137;
  sVar137 = auVar134._8_2_;
  uVar169 = (ushort)(sVar205 < sVar137) * sVar205 | (ushort)(sVar205 >= sVar137) * sVar137;
  sVar137 = auVar134._10_2_;
  uVar170 = (ushort)(sVar206 < sVar137) * sVar206 | (ushort)(sVar206 >= sVar137) * sVar137;
  sVar137 = auVar134._12_2_;
  sVar210 = auVar134._14_2_;
  uVar171 = (ushort)(sVar207 < sVar137) * sVar207 | (ushort)(sVar207 >= sVar137) * sVar137;
  uVar172 = (ushort)(sVar209 < sVar210) * sVar209 | (ushort)(sVar209 >= sVar210) * sVar210;
  sVar137 = auVar250._0_2_;
  uVar296 = (ushort)(sVar195 < sVar137) * sVar195 | (ushort)(sVar195 >= sVar137) * sVar137;
  sVar137 = auVar250._2_2_;
  uVar300 = (ushort)(sVar196 < sVar137) * sVar196 | (ushort)(sVar196 >= sVar137) * sVar137;
  sVar137 = auVar250._4_2_;
  uVar301 = (ushort)(sVar197 < sVar137) * sVar197 | (ushort)(sVar197 >= sVar137) * sVar137;
  sVar137 = auVar250._6_2_;
  uVar302 = (ushort)(sVar204 < sVar137) * sVar204 | (ushort)(sVar204 >= sVar137) * sVar137;
  sVar137 = auVar250._8_2_;
  uVar303 = (ushort)(sVar205 < sVar137) * sVar205 | (ushort)(sVar205 >= sVar137) * sVar137;
  sVar137 = auVar250._10_2_;
  uVar304 = (ushort)(sVar206 < sVar137) * sVar206 | (ushort)(sVar206 >= sVar137) * sVar137;
  sVar137 = auVar250._12_2_;
  sVar210 = auVar250._14_2_;
  uVar305 = (ushort)(sVar207 < sVar137) * sVar207 | (ushort)(sVar207 >= sVar137) * sVar137;
  uVar306 = (ushort)(sVar209 < sVar210) * sVar209 | (ushort)(sVar209 >= sVar210) * sVar210;
  sVar137 = auVar157._0_2_;
  uVar261 = (ushort)(sVar195 < sVar137) * sVar195 | (ushort)(sVar195 >= sVar137) * sVar137;
  sVar137 = auVar157._2_2_;
  uVar268 = (ushort)(sVar196 < sVar137) * sVar196 | (ushort)(sVar196 >= sVar137) * sVar137;
  sVar137 = auVar157._4_2_;
  uVar269 = (ushort)(sVar197 < sVar137) * sVar197 | (ushort)(sVar197 >= sVar137) * sVar137;
  sVar137 = auVar157._6_2_;
  uVar270 = (ushort)(sVar204 < sVar137) * sVar204 | (ushort)(sVar204 >= sVar137) * sVar137;
  sVar137 = auVar157._8_2_;
  uVar271 = (ushort)(sVar205 < sVar137) * sVar205 | (ushort)(sVar205 >= sVar137) * sVar137;
  sVar137 = auVar157._10_2_;
  uVar272 = (ushort)(sVar206 < sVar137) * sVar206 | (ushort)(sVar206 >= sVar137) * sVar137;
  sVar137 = auVar157._12_2_;
  sVar210 = auVar157._14_2_;
  uVar273 = (ushort)(sVar207 < sVar137) * sVar207 | (ushort)(sVar207 >= sVar137) * sVar137;
  uVar274 = (ushort)(sVar209 < sVar210) * sVar209 | (ushort)(sVar209 >= sVar210) * sVar210;
  sVar137 = auVar112._0_2_;
  uVar110 = (ushort)(sVar195 < sVar137) * sVar195 | (ushort)(sVar195 >= sVar137) * sVar137;
  sVar137 = auVar112._2_2_;
  uVar116 = (ushort)(sVar196 < sVar137) * sVar196 | (ushort)(sVar196 >= sVar137) * sVar137;
  sVar137 = auVar112._4_2_;
  uVar117 = (ushort)(sVar197 < sVar137) * sVar197 | (ushort)(sVar197 >= sVar137) * sVar137;
  sVar137 = auVar112._6_2_;
  uVar118 = (ushort)(sVar204 < sVar137) * sVar204 | (ushort)(sVar204 >= sVar137) * sVar137;
  sVar137 = auVar112._8_2_;
  uVar120 = (ushort)(sVar205 < sVar137) * sVar205 | (ushort)(sVar205 >= sVar137) * sVar137;
  sVar137 = auVar112._10_2_;
  uVar122 = (ushort)(sVar206 < sVar137) * sVar206 | (ushort)(sVar206 >= sVar137) * sVar137;
  sVar137 = auVar112._12_2_;
  sVar195 = auVar112._14_2_;
  uVar124 = (ushort)(sVar207 < sVar137) * sVar207 | (ushort)(sVar207 >= sVar137) * sVar137;
  uVar126 = (ushort)(sVar209 < sVar195) * sVar209 | (ushort)(sVar209 >= sVar195) * sVar195;
  auVar259._0_2_ =
       (ushort)((short)uVar155 < sVar130) * sVar130 | ((short)uVar155 >= sVar130) * uVar155;
  auVar259._2_2_ =
       (ushort)((short)uVar166 < sVar139) * sVar139 | ((short)uVar166 >= sVar139) * uVar166;
  auVar259._4_2_ =
       (ushort)((short)uVar167 < sVar141) * sVar141 | ((short)uVar167 >= sVar141) * uVar167;
  auVar259._6_2_ =
       (ushort)((short)uVar168 < sVar142) * sVar142 | ((short)uVar168 >= sVar142) * uVar168;
  auVar259._8_2_ =
       (ushort)((short)uVar169 < sVar143) * sVar143 | ((short)uVar169 >= sVar143) * uVar169;
  auVar259._10_2_ =
       (ushort)((short)uVar170 < sVar144) * sVar144 | ((short)uVar170 >= sVar144) * uVar170;
  auVar259._12_2_ =
       (ushort)((short)uVar171 < sVar145) * sVar145 | ((short)uVar171 >= sVar145) * uVar171;
  auVar259._14_2_ =
       (ushort)((short)uVar172 < sVar194) * sVar194 | ((short)uVar172 >= sVar194) * uVar172;
  auVar299._0_2_ =
       (ushort)((short)uVar296 < sVar130) * sVar130 | ((short)uVar296 >= sVar130) * uVar296;
  auVar299._2_2_ =
       (ushort)((short)uVar300 < sVar139) * sVar139 | ((short)uVar300 >= sVar139) * uVar300;
  auVar299._4_2_ =
       (ushort)((short)uVar301 < sVar141) * sVar141 | ((short)uVar301 >= sVar141) * uVar301;
  auVar299._6_2_ =
       (ushort)((short)uVar302 < sVar142) * sVar142 | ((short)uVar302 >= sVar142) * uVar302;
  auVar299._8_2_ =
       (ushort)((short)uVar303 < sVar143) * sVar143 | ((short)uVar303 >= sVar143) * uVar303;
  auVar299._10_2_ =
       (ushort)((short)uVar304 < sVar144) * sVar144 | ((short)uVar304 >= sVar144) * uVar304;
  auVar299._12_2_ =
       (ushort)((short)uVar305 < sVar145) * sVar145 | ((short)uVar305 >= sVar145) * uVar305;
  auVar299._14_2_ =
       (ushort)((short)uVar306 < sVar194) * sVar194 | ((short)uVar306 >= sVar194) * uVar306;
  auVar267._0_2_ =
       (ushort)((short)uVar261 < sVar130) * sVar130 | ((short)uVar261 >= sVar130) * uVar261;
  auVar267._2_2_ =
       (ushort)((short)uVar268 < sVar139) * sVar139 | ((short)uVar268 >= sVar139) * uVar268;
  auVar267._4_2_ =
       (ushort)((short)uVar269 < sVar141) * sVar141 | ((short)uVar269 >= sVar141) * uVar269;
  auVar267._6_2_ =
       (ushort)((short)uVar270 < sVar142) * sVar142 | ((short)uVar270 >= sVar142) * uVar270;
  auVar267._8_2_ =
       (ushort)((short)uVar271 < sVar143) * sVar143 | ((short)uVar271 >= sVar143) * uVar271;
  auVar267._10_2_ =
       (ushort)((short)uVar272 < sVar144) * sVar144 | ((short)uVar272 >= sVar144) * uVar272;
  auVar267._12_2_ =
       (ushort)((short)uVar273 < sVar145) * sVar145 | ((short)uVar273 >= sVar145) * uVar273;
  auVar267._14_2_ =
       (ushort)((short)uVar274 < sVar194) * sVar194 | ((short)uVar274 >= sVar194) * uVar274;
  auVar253._0_2_ =
       (ushort)((short)uVar110 < sVar130) * sVar130 | ((short)uVar110 >= sVar130) * uVar110;
  auVar253._2_2_ =
       (ushort)((short)uVar116 < sVar139) * sVar139 | ((short)uVar116 >= sVar139) * uVar116;
  auVar253._4_2_ =
       (ushort)((short)uVar117 < sVar141) * sVar141 | ((short)uVar117 >= sVar141) * uVar117;
  auVar253._6_2_ =
       (ushort)((short)uVar118 < sVar142) * sVar142 | ((short)uVar118 >= sVar142) * uVar118;
  auVar253._8_2_ =
       (ushort)((short)uVar120 < sVar143) * sVar143 | ((short)uVar120 >= sVar143) * uVar120;
  auVar253._10_2_ =
       (ushort)((short)uVar122 < sVar144) * sVar144 | ((short)uVar122 >= sVar144) * uVar122;
  auVar253._12_2_ =
       (ushort)((short)uVar124 < sVar145) * sVar145 | ((short)uVar124 >= sVar145) * uVar124;
  auVar253._14_2_ =
       (ushort)((short)uVar126 < sVar194) * sVar194 | ((short)uVar126 >= sVar194) * uVar126;
  auVar113 = paddsw(auVar259,auVar202);
  auVar157 = paddsw(auVar299,auVar202);
  auVar134 = paddsw(auVar267,auVar202);
  auVar112 = paddsw(auVar253,auVar202);
  if ((ushort)((ushort)(SUB161(auVar188 >> 7,0) & 1) | (ushort)(SUB161(auVar188 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar188 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar188 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar188 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar188 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar188 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar188 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar188 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar188 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar188 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar188 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar188 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar188 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar188 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar188[0xf] >> 7) << 0xf) != 0xffff) {
    sVar194 = sVar294 + sVar293 + sVar295 + sVar285 * 2 + 4;
    sVar204 = uVar51 + uVar50 + uVar52 + uVar49 * 2 + 4;
    sVar209 = sVar138 + sVar136 + sVar140 + sVar129 * 2 + 4;
    sVar214 = uVar59 + uVar58 + uVar60 + uVar57 * 2 + 4;
    sVar218 = sVar191 + sVar190 + sVar192 + sVar178 * 2 + 4;
    sVar222 = uVar67 + uVar66 + uVar68 + uVar65 * 2 + 4;
    sVar226 = sVar208 + sVar203 + sVar213 + sVar193 * 2 + 4;
    sVar230 = uVar75 + uVar74 + uVar76 + uVar73 * 2 + 4;
    sVar130 = sVar281 + sVar282;
    sVar137 = uVar53 + uVar54;
    sVar139 = sVar151 + sVar152;
    sVar141 = uVar61 + uVar62;
    sVar142 = sVar119 + sVar121;
    sVar143 = uVar69 + uVar70;
    sVar144 = sVar240 + sVar241;
    sVar145 = uVar77 + uVar78;
    sVar195 = (sVar194 - sVar285) + sVar283;
    sVar205 = (sVar204 - uVar49) + uVar55;
    sVar210 = (sVar209 - sVar129) + sVar153;
    sVar215 = (sVar214 - uVar57) + uVar63;
    sVar219 = (sVar218 - sVar178) + sVar123;
    sVar223 = (sVar222 - uVar65) + uVar71;
    sVar227 = (sVar226 - sVar193) + sVar242;
    sVar231 = (sVar230 - uVar73) + uVar79;
    sVar196 = (sVar195 - sVar285) + sVar284;
    sVar206 = (sVar205 - uVar49) + uVar56;
    sVar211 = (sVar210 - sVar129) + sVar154;
    sVar216 = (sVar215 - uVar57) + uVar64;
    sVar220 = (sVar219 - sVar178) + sVar125;
    sVar224 = (sVar223 - uVar65) + uVar72;
    sVar228 = (sVar227 - sVar193) + sVar243;
    sVar232 = (sVar231 - uVar73) + uVar80;
    sVar197 = (sVar196 - sVar293) + sVar284;
    sVar207 = (sVar206 - uVar50) + uVar56;
    sVar212 = (sVar211 - sVar136) + sVar154;
    sVar217 = (sVar216 - uVar58) + uVar64;
    sVar221 = (sVar220 - sVar190) + sVar125;
    sVar225 = (sVar224 - uVar66) + uVar72;
    sVar229 = (sVar228 - sVar203) + sVar243;
    sVar233 = (sVar232 - uVar74) + uVar80;
    auVar127._0_2_ = (ushort)((sVar283 - sVar294) + sVar284 + sVar130 + sVar197) >> 3;
    auVar127._2_2_ = (ushort)((uVar55 - uVar51) + uVar56 + sVar137 + sVar207) >> 3;
    auVar127._4_2_ = (ushort)((sVar153 - sVar138) + sVar154 + sVar139 + sVar212) >> 3;
    auVar127._6_2_ = (ushort)((uVar63 - uVar59) + uVar64 + sVar141 + sVar217) >> 3;
    auVar127._8_2_ = (ushort)((sVar123 - sVar191) + sVar125 + sVar142 + sVar221) >> 3;
    auVar127._10_2_ = (ushort)((uVar71 - uVar67) + uVar72 + sVar143 + sVar225) >> 3;
    auVar127._12_2_ = (ushort)((sVar242 - sVar208) + sVar243 + sVar144 + sVar229) >> 3;
    auVar127._14_2_ = (ushort)((uVar79 - uVar75) + uVar80 + sVar145 + sVar233) >> 3;
    auVar114._0_2_ = (ushort)(sVar281 + sVar293 + sVar285 + sVar194) >> 3;
    auVar114._2_2_ = (ushort)(uVar53 + uVar50 + uVar49 + sVar204) >> 3;
    auVar114._4_2_ = (ushort)(sVar151 + sVar136 + sVar129 + sVar209) >> 3;
    auVar114._6_2_ = (ushort)(uVar61 + uVar58 + uVar57 + sVar214) >> 3;
    auVar114._8_2_ = (ushort)(sVar119 + sVar190 + sVar178 + sVar218) >> 3;
    auVar114._10_2_ = (ushort)(uVar69 + uVar66 + uVar65 + sVar222) >> 3;
    auVar114._12_2_ = (ushort)(sVar240 + sVar203 + sVar193 + sVar226) >> 3;
    auVar114._14_2_ = (ushort)(uVar77 + uVar74 + uVar73 + sVar230) >> 3;
    auVar238 = auVar238 & auVar188 | ~auVar188 & auVar127;
    auVar135._0_2_ = (ushort)(sVar130 + sVar294 + sVar194) >> 3;
    auVar135._2_2_ = (ushort)(sVar137 + uVar51 + sVar204) >> 3;
    auVar135._4_2_ = (ushort)(sVar139 + sVar138 + sVar209) >> 3;
    auVar135._6_2_ = (ushort)(sVar141 + uVar59 + sVar214) >> 3;
    auVar135._8_2_ = (ushort)(sVar142 + sVar191 + sVar218) >> 3;
    auVar135._10_2_ = (ushort)(sVar143 + uVar67 + sVar222) >> 3;
    auVar135._12_2_ = (ushort)(sVar144 + sVar208 + sVar226) >> 3;
    auVar135._14_2_ = (ushort)(sVar145 + uVar75 + sVar230) >> 3;
    auVar280 = auVar280 & auVar188 | ~auVar188 & auVar114;
    auVar292._0_2_ = (ushort)(sVar295 + sVar130 + sVar195) >> 3;
    auVar292._2_2_ = (ushort)(uVar52 + sVar137 + sVar205) >> 3;
    auVar292._4_2_ = (ushort)(sVar140 + sVar139 + sVar210) >> 3;
    auVar292._6_2_ = (ushort)(uVar60 + sVar141 + sVar215) >> 3;
    auVar292._8_2_ = (ushort)(sVar192 + sVar142 + sVar219) >> 3;
    auVar292._10_2_ = (ushort)(uVar68 + sVar143 + sVar223) >> 3;
    auVar292._12_2_ = (ushort)(sVar213 + sVar144 + sVar227) >> 3;
    auVar292._14_2_ = (ushort)(uVar76 + sVar145 + sVar231) >> 3;
    auVar112 = auVar112 & auVar188 | ~auVar188 & auVar135;
    auVar160._0_2_ = (ushort)(sVar281 + sVar130 + sVar196) >> 3;
    auVar160._2_2_ = (ushort)(uVar53 + sVar137 + sVar206) >> 3;
    auVar160._4_2_ = (ushort)(sVar151 + sVar139 + sVar211) >> 3;
    auVar160._6_2_ = (ushort)(uVar61 + sVar141 + sVar216) >> 3;
    auVar160._8_2_ = (ushort)(sVar119 + sVar142 + sVar220) >> 3;
    auVar160._10_2_ = (ushort)(uVar69 + sVar143 + sVar224) >> 3;
    auVar160._12_2_ = (ushort)(sVar240 + sVar144 + sVar228) >> 3;
    auVar160._14_2_ = (ushort)(uVar77 + sVar145 + sVar232) >> 3;
    auVar157 = auVar157 & auVar188 | ~auVar188 & auVar292;
    auVar113 = auVar113 & auVar188 | ~auVar188 & auVar160;
    auVar173._0_2_ = (ushort)(sVar282 + sVar130 + sVar197) >> 3;
    auVar173._2_2_ = (ushort)(uVar54 + sVar137 + sVar207) >> 3;
    auVar173._4_2_ = (ushort)(sVar152 + sVar139 + sVar212) >> 3;
    auVar173._6_2_ = (ushort)(uVar62 + sVar141 + sVar217) >> 3;
    auVar173._8_2_ = (ushort)(sVar121 + sVar142 + sVar221) >> 3;
    auVar173._10_2_ = (ushort)(uVar70 + sVar143 + sVar225) >> 3;
    auVar173._12_2_ = (ushort)(sVar241 + sVar144 + sVar229) >> 3;
    auVar173._14_2_ = (ushort)(uVar78 + sVar145 + sVar233) >> 3;
    auVar134 = auVar134 & auVar188 | ~auVar188 & auVar173;
  }
  uVar131 = CONCAT22(auVar280._6_2_,uVar57);
  Var107 = CONCAT64(CONCAT42(uVar131,auVar280._4_2_),CONCAT22(sVar129,uVar57));
  auVar91._4_8_ = (long)((unkuint10)Var107 >> 0x10);
  auVar91._2_2_ = auVar280._2_2_;
  auVar91._0_2_ = uVar49;
  auVar115._0_4_ = CONCAT22(auVar280._0_2_,sVar285);
  auVar115._4_12_ = auVar91;
  auVar150._0_12_ = auVar112._0_12_;
  auVar150._12_2_ = auVar112._6_2_;
  auVar150._14_2_ = auVar157._6_2_;
  auVar149._12_4_ = auVar150._12_4_;
  auVar149._0_10_ = auVar112._0_10_;
  auVar149._10_2_ = auVar157._4_2_;
  auVar148._10_6_ = auVar149._10_6_;
  auVar148._0_8_ = auVar112._0_8_;
  auVar148._8_2_ = auVar112._4_2_;
  auVar92._4_8_ = auVar148._8_8_;
  auVar92._2_2_ = auVar157._2_2_;
  auVar92._0_2_ = auVar112._2_2_;
  auVar164._0_12_ = auVar113._0_12_;
  auVar164._12_2_ = auVar113._6_2_;
  auVar164._14_2_ = auVar134._6_2_;
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._0_10_ = auVar113._0_10_;
  auVar163._10_2_ = auVar134._4_2_;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._0_8_ = auVar113._0_8_;
  auVar162._8_2_ = auVar113._4_2_;
  auVar93._4_8_ = auVar162._8_8_;
  auVar93._2_2_ = auVar134._2_2_;
  auVar93._0_2_ = auVar113._2_2_;
  auVar161._0_4_ = CONCAT22(auVar134._0_2_,auVar113._0_2_);
  auVar161._4_12_ = auVar93;
  auVar176._0_12_ = auVar238._0_12_;
  auVar176._12_2_ = auVar238._6_2_;
  auVar176._14_2_ = uVar64;
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._0_10_ = auVar238._0_10_;
  auVar175._10_2_ = sVar154;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._0_8_ = auVar238._0_8_;
  auVar174._8_2_ = auVar238._4_2_;
  auVar94._4_8_ = auVar174._8_8_;
  auVar94._2_2_ = uVar56;
  auVar94._0_2_ = auVar238._2_2_;
  auVar128._0_8_ = auVar115._0_8_;
  auVar128._8_4_ = auVar91._0_4_;
  auVar128._12_4_ = auVar92._0_4_;
  auVar189._0_8_ = auVar161._0_8_;
  auVar189._8_4_ = auVar93._0_4_;
  auVar189._12_4_ = auVar94._0_4_;
  uVar244 = CONCAT22(auVar280._8_2_,sVar178);
  auVar245._0_8_ = CONCAT26(auVar280._10_2_,CONCAT24(uVar65,uVar244));
  auVar245._8_2_ = sVar193;
  auVar245._10_2_ = auVar280._12_2_;
  auVar246._12_2_ = uVar73;
  auVar246._0_12_ = auVar245;
  auVar246._14_2_ = auVar280._14_2_;
  uVar247 = CONCAT22(auVar157._8_2_,auVar112._8_2_);
  auVar248._0_8_ = CONCAT26(auVar157._10_2_,CONCAT24(auVar112._10_2_,uVar247));
  auVar248._8_2_ = auVar112._12_2_;
  auVar248._10_2_ = auVar157._12_2_;
  auVar254._12_2_ = auVar112._14_2_;
  auVar254._0_12_ = auVar248;
  auVar254._14_2_ = auVar157._14_2_;
  uVar255 = CONCAT22(auVar134._8_2_,auVar113._8_2_);
  auVar256._0_8_ = CONCAT26(auVar134._10_2_,CONCAT24(auVar113._10_2_,uVar255));
  auVar256._8_2_ = auVar113._12_2_;
  auVar256._10_2_ = auVar134._12_2_;
  auVar260._12_2_ = auVar113._14_2_;
  auVar260._0_12_ = auVar256;
  auVar260._14_2_ = auVar134._14_2_;
  uVar234 = CONCAT22(sVar125,auVar238._8_2_);
  auVar236._0_8_ = CONCAT26(uVar72,CONCAT24(auVar238._10_2_,uVar234));
  auVar236._8_2_ = auVar238._12_2_;
  auVar236._10_2_ = sVar243;
  auVar239._12_2_ = auVar238._14_2_;
  auVar239._0_12_ = auVar236;
  auVar239._14_2_ = uVar80;
  auVar165._8_4_ = (int)((ulong)auVar245._0_8_ >> 0x20);
  auVar165._0_8_ = auVar245._0_8_;
  auVar165._12_4_ = (int)((ulong)auVar248._0_8_ >> 0x20);
  auVar177._8_4_ = (int)((ulong)auVar256._0_8_ >> 0x20);
  auVar177._0_8_ = auVar256._0_8_;
  auVar177._12_4_ = (int)((ulong)auVar236._0_8_ >> 0x20);
  *(ulong *)(s + -4) = CONCAT44(CONCAT22(auVar157._0_2_,auVar112._0_2_),auVar115._0_4_);
  *(ulong *)s = CONCAT44(CONCAT22(sVar284,auVar238._0_2_),auVar161._0_4_);
  *(long *)(s + (long)p + -4) = auVar128._8_8_;
  *(long *)(s + (long)p + -4 + 4) = auVar189._8_8_;
  puVar1 = s + (long)(p * 2) + -4;
  *(int *)puVar1 = (int)((unkuint10)Var107 >> 0x10);
  *(int *)(puVar1 + 2) = auVar148._8_4_;
  *(int *)(puVar1 + 4) = auVar162._8_4_;
  *(int *)(puVar1 + 6) = auVar174._8_4_;
  *(undefined4 *)(s + lVar109) = uVar131;
  *(undefined4 *)(s + lVar109 + 2) = auVar149._12_4_;
  *(undefined4 *)(s + lVar109 + 4) = auVar163._12_4_;
  *(undefined4 *)(s + lVar109 + 6) = auVar175._12_4_;
  *(ulong *)(s + (long)(p * 4) + -4) = CONCAT44(uVar247,uVar244);
  *(ulong *)(s + (long)(p * 4) + -4 + 4) = CONCAT44(uVar234,uVar255);
  *(long *)(s + (long)(p * 5) + -4) = auVar165._8_8_;
  *(long *)(s + (long)(p * 5) + -4 + 4) = auVar177._8_8_;
  puVar1 = s + (long)(p * 6) + -4;
  *(int *)puVar1 = auVar245._8_4_;
  *(int *)(puVar1 + 2) = auVar248._8_4_;
  *(int *)(puVar1 + 4) = auVar256._8_4_;
  *(int *)(puVar1 + 6) = auVar236._8_4_;
  *(int *)(s + lVar108) = auVar246._12_4_;
  *(int *)(s + lVar108 + 2) = auVar254._12_4_;
  *(int *)(s + lVar108 + 4) = auVar260._12_4_;
  *(int *)(s + lVar108 + 6) = auVar239._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_8_dual_sse2(
    uint16_t *s, int p, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;

  x0 = _mm_loadu_si128((__m128i *)(s - 4 + 0 * p));
  x1 = _mm_loadu_si128((__m128i *)(s - 4 + 1 * p));
  x2 = _mm_loadu_si128((__m128i *)(s - 4 + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)(s - 4 + 3 * p));
  x4 = _mm_loadu_si128((__m128i *)(s - 4 + 4 * p));
  x5 = _mm_loadu_si128((__m128i *)(s - 4 + 5 * p));
  x6 = _mm_loadu_si128((__m128i *)(s - 4 + 6 * p));
  x7 = _mm_loadu_si128((__m128i *)(s - 4 + 7 * p));

  highbd_transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0, &d1,
                           &d2, &d3, &d4, &d5, &d6, &d7);

  highbd_lpf_internal_8_dual_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4,
                                  blimit0, limit0, thresh0, blimit1, limit1,
                                  thresh1, bd);

  highbd_transpose8x8_sse2(&d0, &d1, &d2, &d3, &d4, &d5, &d6, &d7, &x0, &x1,
                           &x2, &x3, &x4, &x5, &x6, &x7);

  _mm_storeu_si128((__m128i *)(s - 4 + 0 * p), x0);
  _mm_storeu_si128((__m128i *)(s - 4 + 1 * p), x1);
  _mm_storeu_si128((__m128i *)(s - 4 + 2 * p), x2);
  _mm_storeu_si128((__m128i *)(s - 4 + 3 * p), x3);
  _mm_storeu_si128((__m128i *)(s - 4 + 4 * p), x4);
  _mm_storeu_si128((__m128i *)(s - 4 + 5 * p), x5);
  _mm_storeu_si128((__m128i *)(s - 4 + 6 * p), x6);
  _mm_storeu_si128((__m128i *)(s - 4 + 7 * p), x7);
}